

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffio.c
# Opt level: O3

void tidyBufAllocWithAllocator(TidyBuffer *buf,TidyAllocator *allocator,uint allocSize)

{
  TidyAllocator *pTVar1;
  
  if (buf != (TidyBuffer *)0x0) {
    buf->bp = (byte *)0x0;
    buf->size = 0;
    buf->allocated = 0;
    *(undefined8 *)&buf->next = 0;
    pTVar1 = &prvTidyg_default_allocator;
    if (allocator != (TidyAllocator *)0x0) {
      pTVar1 = allocator;
    }
    buf->allocator = pTVar1;
    tidyBufCheckAlloc(buf,allocSize,0);
    buf->next = 0;
    return;
  }
  __assert_fail("buf != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/htacg[P]tidy-html5/src/buffio.c",
                0x46,"void tidyBufInitWithAllocator(TidyBuffer *, TidyAllocator *)");
}

Assistant:

void TIDY_CALL tidyBufInitWithAllocator( TidyBuffer* buf,
                                         TidyAllocator *allocator )
{
    assert( buf != NULL );
    TidyClearMemory( buf, sizeof(TidyBuffer) );
    buf->allocator = allocator ? allocator : &TY_(g_default_allocator);
}